

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip38.c
# Opt level: O2

int get_flags(char *bip38,uchar *bytes,size_t bytes_len,size_t *written)

{
  int iVar1;
  size_t serialized_len;
  bip38_layout_t buf;
  
  iVar1 = -2;
  if (written != (size_t *)0x0) {
    *written = 0;
    if (bytes == (uchar *)0x0) {
      iVar1 = wally_base58_to_bytes(bip38,1,&buf.prefix,0x2b,&serialized_len);
      if (iVar1 != 0) {
        return iVar1;
      }
      if (serialized_len != 0x27) {
        return -2;
      }
    }
    else {
      if (bytes_len != 0x27) {
        return -2;
      }
      buf.u._29_7_ = (undefined7)((ulong)*(undefined8 *)(bytes + 0x1f) >> 8);
      buf._1_8_ = *(undefined8 *)bytes;
      buf.u._5_8_ = *(undefined8 *)(bytes + 8);
      buf.u._13_8_ = *(undefined8 *)(bytes + 0x10);
      buf.u._21_7_ = (undefined7)*(undefined8 *)(bytes + 0x18);
      buf.u.normal.half2[8] = (uchar)((ulong)*(undefined8 *)(bytes + 0x18) >> 0x38);
    }
    *written = (ulong)((uint)(buf.ec_type != 'B') * 0x200 + (buf.flags & 0x20) * 8);
    wally_clear(&buf,0x2c);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int get_flags(const char *bip38,
                     const unsigned char *bytes, size_t bytes_len,
                     size_t *written)
{
    struct bip38_layout_t buf;

    if (!written)
        return WALLY_EINVAL;

    *written = 0;

    if (bytes) {
        if (bytes_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
        memcpy(&buf.prefix, bytes, BIP38_SERIALIZED_LEN);
    } else {
        size_t serialized_len;
        int ret;
        if ((ret = wally_base58_to_bytes(bip38, BASE58_FLAG_CHECKSUM, &buf.prefix,
                                         BIP38_SERIALIZED_LEN + BASE58_CHECKSUM_LEN,
                                         &serialized_len)))
            return ret;

        if (serialized_len != BIP38_SERIALIZED_LEN)
            return WALLY_EINVAL;
    }

    *written = buf.ec_type != BIP38_NO_ECMUL ? BIP38_KEY_EC_MULT : 0;
    *written |= buf.flags & BIP38_FLAG_COMPRESSED ? BIP38_KEY_COMPRESSED : 0;

    wally_clear(&buf, sizeof(buf));

    return WALLY_OK;
}